

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

Symbol * __thiscall
vkt::shaderexecutor::PrecisionCase::makeSymbol<tcu::Vector<float,4>>
          (Symbol *__return_storage_ptr__,PrecisionCase *this,
          Variable<tcu::Vector<float,_4>_> *variable)

{
  Precision prec;
  VarType local_58;
  string local_40;
  Variable<tcu::Vector<float,_4>_> *local_20;
  Variable<tcu::Vector<float,_4>_> *variable_local;
  PrecisionCase *this_local;
  
  local_20 = variable;
  variable_local = (Variable<tcu::Vector<float,_4>_> *)this;
  this_local = (PrecisionCase *)__return_storage_ptr__;
  Variable<tcu::Vector<float,4>>::getName_abi_cxx11_(&local_40,variable);
  getVarTypeOf<tcu::Vector<float,4>>
            (&local_58,(shaderexecutor *)(ulong)(this->m_ctx).precision,prec);
  Symbol::Symbol(__return_storage_ptr__,&local_40,&local_58);
  glu::VarType::~VarType(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Symbol				makeSymbol		(const Variable<T>& variable)
	{
		return Symbol(variable.getName(), getVarTypeOf<T>(m_ctx.precision));
	}